

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<true,_false,_false>::solve_(DaTrie<true,_false,_false> *this,Query *query)

{
  uint8_t *puVar1;
  pointer pBVar2;
  uint32_t base;
  byte bVar3;
  uint uVar4;
  uint32_t node_pos;
  Edge *edge;
  Edge edges [2];
  Edge EStack_238;
  Edge local_130;
  
  memset(&EStack_238,0,0x210);
  edge_(this,query->node_pos_,&EStack_238,0x100);
  pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = *(uint *)(pBVar2 + query->node_pos_) & 0x7fffffff;
  bVar3 = query->key_[query->pos_];
  if (uVar4 != bVar3) {
    node_pos = *(uint *)&pBVar2[uVar4 ^ bVar3].field_0x4 & 0x7fffffff;
    edge = &local_130;
    edge_(this,node_pos,edge,0x100);
    if (local_130.size_ <= EStack_238.size_) {
      base = xcheck_(this,edge,&this->blocks_);
      goto LAB_0012031f;
    }
    bVar3 = query->key_[query->pos_];
  }
  puVar1 = EStack_238.labels_ + EStack_238.size_;
  EStack_238.size_ = EStack_238.size_ + 1;
  *puVar1 = bVar3;
  base = xcheck_(this,&EStack_238,&this->blocks_);
  EStack_238.size_ = EStack_238.size_ - 1;
  node_pos = query->node_pos_;
  edge = &EStack_238;
LAB_0012031f:
  move_(this,node_pos,base,edge,query);
  return;
}

Assistant:

void solve_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    Edge edges[2] = {};
    edge_(query.node_pos(), edges[0]);

    uint32_t _node_pos = 0;
    auto child_pos = bc_[query.node_pos()].base() ^query.label();

    if (child_pos != 0) {
      _node_pos = bc_[child_pos].check();
      edge_(_node_pos, edges[1]);
    }

    if (child_pos == 0 || edges[0].size() < edges[1].size()) {
      edges[0].push(query.label());
      auto base = xcheck_(edges[0], blocks_);
      edges[0].pop();
      move_(query.node_pos(), base, edges[0], query);
    } else {
      auto base = xcheck_(edges[1], blocks_);
      move_(_node_pos, base, edges[1], query);
    }
  }